

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareRenderer.hpp
# Opt level: O0

Image4u * __thiscall
eos::render::SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader>::
render<float>(Image4u *__return_storage_ptr__,
             SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> *this
             ,Mesh *mesh,Matrix4<float> *model_view_matrix,Matrix4<float> *projection_matrix,
             optional<eos::render::Texture> *texture)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  size_type sVar8;
  size_type sVar9;
  value_type *pvVar10;
  const_reference this_00;
  const_reference pvVar11;
  DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *pDVar12;
  Scalar *pSVar13;
  reference pvVar14;
  CoeffReturnType pfVar15;
  Scalar *pSVar16;
  reference pvVar17;
  DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *pDVar18;
  CoeffReturnType pfVar19;
  reference pvVar20;
  reference this_01;
  const_reference point_a;
  const_reference point_b;
  const_reference point_c;
  Rect<int> RVar21;
  Rect<int> RVar22;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_4f8;
  bool local_4b1;
  bool local_489;
  array<eos::render::detail::Vertex<float>,_3UL> *tri;
  iterator __end0;
  iterator __begin0;
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  *__range3_1;
  Matrix<float,_3,_1,_0,_3,_1> MStack_458;
  Matrix<float,_2,_1,_0,_2,_1> aMStack_44c [2];
  Matrix<float,_4,_1,_0,_4,_1> MStack_438;
  Matrix<float,_3,_1,_0,_3,_1> MStack_428;
  Matrix<float,_2,_1,_0,_2,_1> aMStack_41c [2];
  Matrix<float,_4,_1,_0,_4,_1> MStack_408;
  Matrix<float,_3,_1,_0,_3,_1> MStack_3f8;
  Matrix<float,_2,_1,_0,_2,_1> aMStack_3ec [3];
  int local_3d0;
  int local_3cc;
  int max_y_1;
  int min_y_1;
  int max_x_1;
  int min_x_1;
  Vector2<float> local_3b8;
  Vector2<float> local_3b0;
  undefined8 local_3a8;
  Rect<int> boundingBox_1;
  Vector2<float> local_390;
  Vector2<float> local_388;
  render local_380 [8];
  Vector2<float> v2_screen_1;
  Vector2<float> v1_screen_1;
  Vector2<float> v0_screen_1;
  array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> prospective_tri_1;
  byte local_329;
  Scalar local_328;
  Scalar SStack_324;
  uchar k_1;
  Scalar local_320;
  Scalar local_31c;
  Matrix<float,_4,_1,_0,_4,_1> local_318;
  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
  local_300;
  undefined1 local_2e8 [28];
  Matrix<float,2,1,0,2,1> local_2cc [20];
  undefined1 local_2b8 [28];
  Matrix<float,2,1,0,2,1> local_29c [20];
  undefined1 local_288 [28];
  Matrix<float,2,1,0,2,1> local_26c [28];
  undefined1 local_250 [8];
  vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
  vertices;
  anon_class_1_0_00000001 aaStack_228 [12];
  Matrix<float,2,1,0,2,1> aMStack_21c [20];
  Matrix<float,_4,_1,_0,_4,_1> MStack_208;
  anon_class_1_0_00000001 aaStack_1f8 [12];
  Matrix<float,2,1,0,2,1> aMStack_1ec [20];
  Matrix<float,_4,_1,_0,_4,_1> MStack_1d8;
  anon_class_1_0_00000001 aaStack_1c8 [12];
  Matrix<float,2,1,0,2,1> aMStack_1bc [36];
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  Vector2<float> local_188;
  Vector2<float> local_180;
  undefined8 local_178;
  Rect<int> boundingBox;
  Vector2<float> local_160;
  Vector2<float> local_158;
  render local_150 [8];
  Vector2<float> v2_screen;
  Vector2<float> v1_screen;
  Vector2<float> v0_screen;
  array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> prospective_tri;
  Scalar w_cc;
  Scalar z_cc;
  Scalar y_cc;
  Scalar x_cc;
  uchar k;
  uchar visibility_bits [3];
  value_type *tri_tc_indices;
  value_type *tri_indices;
  size_t tri_index;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *pvStack_d0;
  anon_class_1_0_00000001 get_color_or_zero;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *tti;
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  triangles_to_raster;
  Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> local_a0;
  undefined1 local_98 [16];
  value_type local_88;
  MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *local_70;
  Matrix<float,_3,_1,_0,_3,_1> *vertex_position;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  *__range3;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  clipspace_vertices;
  optional<eos::render::Texture> *texture_local;
  Matrix4<float> *projection_matrix_local;
  Matrix4<float> *model_view_matrix_local;
  Mesh *mesh_local;
  SoftwareRenderer<eos::render::VertexShader,_eos::render::TexturingFragmentShader> *this_local;
  
  clipspace_vertices.
  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)texture;
  sVar8 = std::
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ::size(&mesh->vertices);
  sVar9 = std::
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ::size(&mesh->colors);
  local_489 = true;
  if (sVar8 != sVar9) {
    local_489 = std::
                vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ::empty(&mesh->colors);
  }
  if (local_489 == false) {
    __assert_fail("mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x68,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  sVar8 = std::
          vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ::size(&mesh->vertices);
  sVar9 = std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::size(&mesh->texcoords);
  local_4b1 = true;
  if (sVar8 != sVar9) {
    sVar8 = std::
            vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
            ::size(&mesh->vertices);
    sVar9 = std::
            vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ::size(&mesh->texcoords);
    if (sVar8 != sVar9) {
      bVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                        (&mesh->tti);
      local_4b1 = true;
      if (!bVar6) goto LAB_00114454;
    }
    local_4b1 = std::
                vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ::empty(&mesh->texcoords);
  }
LAB_00114454:
  if (local_4b1 == false) {
    __assert_fail("mesh.vertices.size() == mesh.texcoords.size() || ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) || mesh.texcoords.empty()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x70,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  bVar7 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                    (&mesh->tti);
  bVar6 = true;
  if (!bVar7) {
    sVar8 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                      (&mesh->tti);
    sVar9 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                      (&mesh->tvi);
    bVar6 = sVar8 == sVar9;
  }
  if (!bVar6) {
    __assert_fail("mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x72,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  bVar7 = std::optional<eos::render::Texture>::has_value
                    ((optional<eos::render::Texture> *)
                     clipspace_vertices.
                     super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar6 = true;
  if (bVar7) {
    bVar7 = std::optional<eos::render::Texture>::has_value
                      ((optional<eos::render::Texture> *)
                       clipspace_vertices.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar6 = false;
    if (bVar7) {
      sVar8 = std::
              vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ::size(&mesh->texcoords);
      bVar6 = sVar8 != 0;
    }
  }
  if (!bVar6) {
    __assert_fail("!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/render/SoftwareRenderer.hpp"
                  ,0x75,
                  "core::Image4u eos::render::SoftwareRenderer<eos::render::VertexShader, eos::render::TexturingFragmentShader>::render(const core::Mesh &, const Eigen::Matrix4<T> &, const Eigen::Matrix4<T> &, const cpp17::optional<Texture> &) [VertexShaderType = eos::render::VertexShader, FragmentShaderType = eos::render::TexturingFragmentShader, T = float]"
                 );
  }
  std::
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  ::vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            *)&__range3);
  __end3 = std::
           vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
           ::begin(&mesh->vertices);
  vertex_position =
       (Matrix<float,_3,_1,_0,_3,_1> *)
       std::
       vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
       ::end(&mesh->vertices);
  while (bVar6 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
                                     *)&vertex_position), bVar6) {
    local_70 = (MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)
               __gnu_cxx::
               __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
               ::operator*(&__end3);
    local_a0.m_matrix =
         (Nested)Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::homogeneous(local_70);
    Eigen::Matrix<float,4,1,0,4,1>::Matrix<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
              ((Matrix<float,4,1,0,4,1> *)local_98,&local_a0);
    VertexShader::operator()
              ((VertexShader *)&local_88,(Vector4<float> *)&this->field_0x90,
               (Matrix4<float> *)local_98,model_view_matrix);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::push_back((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 *)&__range3,&local_88);
    __gnu_cxx::
    __normal_iterator<const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_*,_std::vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
    ::operator++(&__end3);
  }
  std::
  vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
  ::vector((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
            *)&tti);
  bVar6 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::empty
                    (&mesh->tti);
  RVar21.width = boundingBox.x;
  RVar21.height = boundingBox.y;
  RVar21.x = (int)local_178;
  RVar21.y = local_178._4_4_;
  if (bVar6) {
    local_4f8 = &mesh->tvi;
  }
  else {
    local_4f8 = &mesh->tti;
  }
  pvStack_d0 = local_4f8;
  tri_indices = (value_type *)0x0;
  do {
    boundingBox._0_8_ = RVar21._8_8_;
    local_178 = RVar21._0_8_;
    pvVar10 = (value_type *)
              std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::size
                        (&mesh->tvi);
    if (pvVar10 <= tri_indices) {
      __end0 = std::
               vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
               ::begin((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                        *)&tti);
      tri = (array<eos::render::detail::Vertex<float>,_3UL> *)
            std::
            vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
            ::end((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                   *)&tti);
      while (bVar6 = __gnu_cxx::operator!=
                               (&__end0,(__normal_iterator<std::array<eos::render::detail::Vertex<float>,_3UL>_*,_std::vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>_>
                                         *)&tri), bVar6) {
        this_01 = __gnu_cxx::
                  __normal_iterator<std::array<eos::render::detail::Vertex<float>,_3UL>_*,_std::vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>_>
                  ::operator*(&__end0);
        point_a = std::array<eos::render::detail::Vertex<float>,_3UL>::operator[](this_01,0);
        point_b = std::array<eos::render::detail::Vertex<float>,_3UL>::operator[](this_01,1);
        point_c = std::array<eos::render::detail::Vertex<float>,_3UL>::operator[](this_01,2);
        Rasterizer<eos::render::TexturingFragmentShader>::raster_triangle<float>
                  (&this->rasterizer,point_a,point_b,point_c,
                   (optional<eos::render::Texture> *)
                   clipspace_vertices.
                   super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<std::array<eos::render::detail::Vertex<float>,_3UL>_*,_std::vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>_>
        ::operator++(&__end0);
      }
      core::Image<eos::core::Pixel<unsigned_char,_4>_>::Image
                (__return_storage_ptr__,&(this->rasterizer).colorbuffer);
      std::
      vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
      ::~vector((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                 *)&tti);
      std::
      vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
      ::~vector((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 *)&__range3);
      return __return_storage_ptr__;
    }
    this_00 = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                        (&mesh->tvi,(size_type)tri_indices);
    _x_cc = std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::operator[]
                      (pvStack_d0,(size_type)tri_indices);
    for (y_cc._0_1_ = 0; RVar21.width = boundingBox.x, RVar21.height = boundingBox.y,
        RVar21.x = (int)local_178, RVar21.y = local_178._4_4_, y_cc._0_1_ < 3;
        y_cc._0_1_ = y_cc._0_1_ + 1) {
      *(undefined1 *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) = 0;
      pvVar11 = std::array<int,_3UL>::operator[](this_00,(ulong)y_cc._0_1_);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                std::
                vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                              *)&__range3,(long)*pvVar11);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
      fVar1 = *pSVar13;
      pvVar11 = std::array<int,_3UL>::operator[](this_00,(ulong)y_cc._0_1_);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                std::
                vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                              *)&__range3,(long)*pvVar11);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
      fVar2 = *pSVar13;
      pvVar11 = std::array<int,_3UL>::operator[](this_00,(ulong)y_cc._0_1_);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                std::
                vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                              *)&__range3,(long)*pvVar11);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::z(pDVar12);
      fVar3 = *pSVar13;
      pvVar11 = std::array<int,_3UL>::operator[](this_00,(ulong)y_cc._0_1_);
      pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                std::
                vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                              *)&__range3,(long)*pvVar11);
      pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::w(pDVar12);
      fVar4 = *pSVar13;
      if (fVar1 < -fVar4) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 1;
      }
      if (fVar4 < fVar1) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 2;
      }
      if (fVar2 < -fVar4) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 4;
      }
      if (fVar4 < fVar2) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 8;
      }
      if (((this->enable_near_clipping & 1U) != 0) && (fVar3 < -fVar4)) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 0x10;
      }
      if ((((this->rasterizer).enable_far_clipping & 1U) != 0) && (fVar4 < fVar3)) {
        *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) =
             *(byte *)((long)&y_cc + (ulong)y_cc._0_1_ + 1) | 0x20;
      }
    }
    if ((y_cc._1_1_ & y_cc._2_1_ & y_cc._3_1_) == 0) {
      iVar5 = (int)mesh;
      if ((y_cc._1_1_ == 0 && y_cc._2_1_ == 0) && y_cc._3_1_ == 0) {
        pvVar11 = std::array<int,_3UL>::operator[](this_00,0);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        detail::divide_by_w<float>((detail *)&v0_screen,pvVar14);
        pvVar11 = std::array<int,_3UL>::operator[](this_00,1);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        detail::divide_by_w<float>
                  ((detail *)
                   (prospective_tri._M_elems[0].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 2),pvVar14);
        pvVar11 = std::array<int,_3UL>::operator[](this_00,2);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        detail::divide_by_w<float>
                  ((detail *)
                   (prospective_tri._M_elems[1].
                    super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                    array + 2),pvVar14);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        fVar1 = *pSVar13;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        clip_to_screen_space<float>
                  ((render *)&v1_screen,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                   (this->rasterizer).viewport_height);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&v1_screen);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        *pSVar13 = fVar1;
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&v1_screen);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        *pSVar13 = fVar1;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        fVar1 = *pSVar13;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        clip_to_screen_space<float>
                  ((render *)&v2_screen,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                   (this->rasterizer).viewport_height);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&v2_screen);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        *pSVar13 = fVar1;
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)&v2_screen);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        *pSVar13 = fVar1;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        fVar1 = *pSVar13;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        clip_to_screen_space<float>
                  (local_150,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                   (this->rasterizer).viewport_height);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)local_150);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        *pSVar13 = fVar1;
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                            ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)local_150);
        fVar1 = *pfVar15;
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        *pSVar13 = fVar1;
        if ((this->enable_backface_culling & 1U) != 0) {
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
          pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<float,2,1,0,2,1> *)&local_158,pSVar13,pSVar16);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
          pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<float,2,1,0,2,1> *)&local_160,pSVar13,pSVar16);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
          pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
          pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                    std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
          pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                    ((Matrix<float,2,1,0,2,1> *)&boundingBox.width,pSVar13,pSVar16);
          bVar6 = detail::are_vertices_ccw_in_screen_space<float>
                            (&local_158,&local_160,(Vector2<float> *)&boundingBox.width);
          RVar21.width = boundingBox.x;
          RVar21.height = boundingBox.y;
          RVar21.x = (int)local_178;
          RVar21.y = local_178._4_4_;
          if (((bVar6 ^ 0xffU) & 1) != 0) goto LAB_0011647e;
        }
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
        pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                  ((Matrix<float,2,1,0,2,1> *)&local_180,pSVar13,pSVar16);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
        pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                  ((Matrix<float,2,1,0,2,1> *)&local_188,pSVar13,pSVar16);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
        pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                  std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                            ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
        pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                  ((Matrix<float,2,1,0,2,1> *)&max_x,pSVar13,pSVar16);
        RVar21 = detail::calculate_clipped_bounding_box<float>
                           (&local_180,&local_188,(Vector2<float> *)&max_x,
                            (this->rasterizer).viewport_width,(this->rasterizer).viewport_height);
        local_178._0_4_ = RVar21.x;
        boundingBox.x = RVar21.width;
        local_178._4_4_ = RVar21.y;
        boundingBox.y = RVar21.height;
        if (((int)local_178 < (int)local_178 + boundingBox.x) &&
           (local_178._4_4_ < local_178._4_4_ + boundingBox.y)) {
          local_178 = RVar21._0_8_;
          boundingBox._0_8_ = RVar21._8_8_;
          pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,0);
          Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                    ((Matrix<float,_4,_1,_0,_4,_1> *)
                     &vertices.
                      super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar17);
          std::array<int,_3UL>::operator[](this_00,0);
          render<float>::anon_class_1_0_00000001::operator()
                    (aaStack_228,
                     (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)((long)&tri_index + 7),iVar5 + 0x18);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,0);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,0);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,0);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,1);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(aMStack_21c,pfVar15,pfVar19);
          pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,1);
          Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&MStack_208,pvVar17);
          std::array<int,_3UL>::operator[](this_00,1);
          render<float>::anon_class_1_0_00000001::operator()
                    (aaStack_1f8,
                     (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)((long)&tri_index + 7),iVar5 + 0x18);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,1);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,0);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,1);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,1);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(aMStack_1ec,pfVar15,pfVar19);
          pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                              ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen,2);
          Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&MStack_1d8,pvVar17);
          std::array<int,_3UL>::operator[](this_00,2);
          render<float>::anon_class_1_0_00000001::operator()
                    (aaStack_1c8,
                     (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                      *)((long)&tri_index + 7),iVar5 + 0x18);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,2);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,0);
          pvVar11 = std::array<int,_3UL>::operator[](_x_cc,2);
          pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                    std::
                    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ::operator[](&mesh->texcoords,(long)*pvVar11);
          pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                              (pDVar18,1);
          Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(aMStack_1bc,pfVar15,pfVar19);
          std::
          vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
          ::push_back((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                       *)&tti,(value_type *)
                              &vertices.
                               super__Vector_base<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
          RVar21.width = boundingBox.x;
          RVar21.height = boundingBox.y;
          RVar21.x = (int)local_178;
          RVar21.y = local_178._4_4_;
        }
      }
      else {
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::vector((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                  *)local_250);
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::reserve((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                   *)local_250,3);
        pvVar11 = std::array<int,_3UL>::operator[](this_00,0);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  ((Matrix<float,_4,_1,_0,_4,_1> *)local_288,pvVar14);
        std::array<int,_3UL>::operator[](this_00,0);
        render<float>::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(local_288 + 0x10),
                   (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)((long)&tri_index + 7),iVar5 + 0x18);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,0);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,0);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,0);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,1);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(local_26c,pfVar15,pfVar19);
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::push_back((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                     *)local_250,(value_type *)local_288);
        pvVar11 = std::array<int,_3UL>::operator[](this_00,1);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  ((Matrix<float,_4,_1,_0,_4,_1> *)local_2b8,pvVar14);
        std::array<int,_3UL>::operator[](this_00,1);
        render<float>::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(local_2b8 + 0x10),
                   (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)((long)&tri_index + 7),iVar5 + 0x18);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,1);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,0);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,1);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,1);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(local_29c,pfVar15,pfVar19);
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::push_back((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                     *)local_250,(value_type *)local_2b8);
        pvVar11 = std::array<int,_3UL>::operator[](this_00,2);
        pvVar14 = std::
                  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                *)&__range3,(long)*pvVar11);
        Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                  ((Matrix<float,_4,_1,_0,_4,_1> *)local_2e8,pvVar14);
        std::array<int,_3UL>::operator[](this_00,2);
        render<float>::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)(local_2e8 + 0x10),
                   (vector<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    *)((long)&tri_index + 7),iVar5 + 0x18);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,2);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,0);
        pvVar11 = std::array<int,_3UL>::operator[](_x_cc,2);
        pDVar18 = (DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                  std::
                  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ::operator[](&mesh->texcoords,(long)*pvVar11);
        pfVar19 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::operator()
                            (pDVar18,1);
        Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>(local_2cc,pfVar15,pfVar19);
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::push_back((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                     *)local_250,(value_type *)local_2e8);
        if ((this->enable_near_clipping & 1U) != 0) {
          local_31c = 0.0;
          local_320 = 0.0;
          SStack_324 = -1.0;
          local_328 = -1.0;
          Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                    (&local_318,&local_31c,&local_320,&stack0xfffffffffffffcdc,&local_328);
          detail::clip_polygon_to_plane_in_4d
                    (&local_300,
                     (vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      *)local_250,&local_318);
          std::
          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ::operator=((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                       *)local_250,&local_300);
          std::
          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
          ::~vector(&local_300);
        }
        sVar8 = std::
                vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                ::size((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                        *)local_250);
        RVar22.width = boundingBox_1.x;
        RVar22.height = boundingBox_1.y;
        RVar22.x = (int)local_3a8;
        RVar22.y = local_3a8._4_4_;
        if (2 < sVar8) {
          local_329 = 0;
          while( true ) {
            boundingBox_1._0_8_ = RVar22._8_8_;
            local_3a8 = RVar22._0_8_;
            sVar8 = std::
                    vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                    ::size((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                            *)local_250);
            if (sVar8 - 2 <= (ulong)local_329) break;
            pvVar20 = std::
                      vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                    *)local_250,0);
            detail::divide_by_w<float>((detail *)&v0_screen_1,&pvVar20->position);
            pvVar20 = std::
                      vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                    *)local_250,(ulong)(local_329 + 1));
            detail::divide_by_w<float>
                      ((detail *)
                       (prospective_tri_1._M_elems[0].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array + 2),&pvVar20->position);
            pvVar20 = std::
                      vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                      ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                    *)local_250,(ulong)(local_329 + 2));
            detail::divide_by_w<float>
                      ((detail *)
                       (prospective_tri_1._M_elems[1].
                        super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data
                        .array + 2),&pvVar20->position);
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            fVar1 = *pSVar13;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            clip_to_screen_space<float>
                      ((render *)&v1_screen_1,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                       (this->rasterizer).viewport_height);
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &v1_screen_1);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            *pSVar13 = fVar1;
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &v1_screen_1);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            *pSVar13 = fVar1;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            fVar1 = *pSVar13;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            clip_to_screen_space<float>
                      ((render *)&v2_screen_1,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                       (this->rasterizer).viewport_height);
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &v2_screen_1);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            *pSVar13 = fVar1;
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 &v2_screen_1);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            *pSVar13 = fVar1;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            fVar1 = *pSVar13;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            clip_to_screen_space<float>
                      (local_380,fVar1,*pSVar13,(this->rasterizer).viewport_width,
                       (this->rasterizer).viewport_height);
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::x
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 local_380);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
            *pSVar13 = fVar1;
            pfVar15 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0>::y
                                ((DenseCoeffsBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_0> *)
                                 local_380);
            fVar1 = *pfVar15;
            pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                      std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2);
            pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
            *pSVar13 = fVar1;
            if ((this->enable_backface_culling & 1U) == 0) {
LAB_00116078:
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&local_3b0,pSVar13,pSVar16);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&local_3b8,pSVar13,pSVar16);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&max_x_1,pSVar13,pSVar16);
              RVar22 = detail::calculate_clipped_bounding_box<float>
                                 (&local_3b0,&local_3b8,(Vector2<float> *)&max_x_1,
                                  (this->rasterizer).viewport_width,
                                  (this->rasterizer).viewport_height);
              local_3a8._0_4_ = RVar22.x;
              min_y_1 = (int)local_3a8;
              boundingBox_1.x = RVar22.width;
              max_y_1 = (int)local_3a8 + boundingBox_1.x;
              local_3a8._4_4_ = RVar22.y;
              local_3cc = local_3a8._4_4_;
              boundingBox_1.y = RVar22.height;
              local_3d0 = local_3a8._4_4_ + boundingBox_1.y;
              if (((int)local_3a8 < max_y_1) && (local_3a8._4_4_ < local_3d0)) {
                local_3a8 = RVar22._0_8_;
                boundingBox_1._0_8_ = RVar22._8_8_;
                pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                    ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1
                                     ,0);
                Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix
                          ((Matrix<float,_4,_1,_0,_4,_1> *)&__range3_1,pvVar17);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,0);
                Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&MStack_458,&pvVar20->color);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,0);
                Eigen::Matrix<float,_2,_1,_0,_2,_1>::Matrix(aMStack_44c,&pvVar20->texcoords);
                pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                    ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1
                                     ,1);
                Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&MStack_438,pvVar17);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,(ulong)(local_329 + 1));
                Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&MStack_428,&pvVar20->color);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,(ulong)(local_329 + 1));
                Eigen::Matrix<float,_2,_1,_0,_2,_1>::Matrix(aMStack_41c,&pvVar20->texcoords);
                pvVar17 = std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                    ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1
                                     ,2);
                Eigen::Matrix<float,_4,_1,_0,_4,_1>::Matrix(&MStack_408,pvVar17);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,(ulong)(local_329 + 2));
                Eigen::Matrix<float,_3,_1,_0,_3,_1>::Matrix(&MStack_3f8,&pvVar20->color);
                pvVar20 = std::
                          vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                          ::operator[]((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                                        *)local_250,(ulong)(local_329 + 2));
                Eigen::Matrix<float,_2,_1,_0,_2,_1>::Matrix(aMStack_3ec,&pvVar20->texcoords);
                std::
                vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                ::push_back((vector<std::array<eos::render::detail::Vertex<float>,_3UL>,_std::allocator<std::array<eos::render::detail::Vertex<float>,_3UL>_>_>
                             *)&tti,(value_type *)&__range3_1);
                RVar22.width = boundingBox_1.x;
                RVar22.height = boundingBox_1.y;
                RVar22.x = (int)local_3a8;
                RVar22.y = local_3a8._4_4_;
              }
            }
            else {
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,0
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&local_388,pSVar13,pSVar16);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,1
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&local_390,pSVar13,pSVar16);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2
                                  );
              pSVar13 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::x(pDVar12);
              pDVar12 = (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
                        std::array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL>::operator[]
                                  ((array<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_3UL> *)&v0_screen_1,2
                                  );
              pSVar16 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::y(pDVar12);
              Eigen::Matrix<float,2,1,0,2,1>::Matrix<float,float>
                        ((Matrix<float,2,1,0,2,1> *)&boundingBox_1.width,pSVar13,pSVar16);
              bVar6 = detail::are_vertices_ccw_in_screen_space<float>
                                (&local_388,&local_390,(Vector2<float> *)&boundingBox_1.width);
              RVar22.width = boundingBox_1.x;
              RVar22.height = boundingBox_1.y;
              RVar22.x = (int)local_3a8;
              RVar22.y = local_3a8._4_4_;
              if (((bVar6 ^ 0xffU) & 1) == 0) goto LAB_00116078;
            }
            local_329 = local_329 + 1;
          }
        }
        std::
        vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
        ::~vector((vector<eos::render::detail::Vertex<float>,_std::allocator<eos::render::detail::Vertex<float>_>_>
                   *)local_250);
        RVar21.width = boundingBox.x;
        RVar21.height = boundingBox.y;
        RVar21.x = (int)local_178;
        RVar21.y = local_178._4_4_;
      }
    }
LAB_0011647e:
    tri_indices = (value_type *)((long)tri_indices->_M_elems + 1);
  } while( true );
}

Assistant:

core::Image4u render(const core::Mesh& mesh, const Eigen::Matrix4<T>& model_view_matrix,
                         const Eigen::Matrix4<T>& projection_matrix,
                         const cpp17::optional<Texture>& texture = cpp17::nullopt)
    {
        // The number of vertices has to be equal for both shape and colour, or, alternatively, it has to be a
        // shape-only model:
        assert(mesh.vertices.size() == mesh.colors.size() || mesh.colors.empty());
        // Make sure one of these three things is true:
        //  a) There are texture coordinates given for each vertex (the texture map doesn't contain any seams)
        //  b) A different number of tex coords and vertices (i.e. the texture map contains seams): A separate
        //     list of texture triangle indices has to be given (i.e. mesh.tti is not empty)
        //  c) There are no texture coordinates given (i.e. rendering without texture).
        assert(mesh.vertices.size() == mesh.texcoords.size() ||
               ((mesh.vertices.size() != mesh.texcoords.size()) && !mesh.tti.empty()) ||
               mesh.texcoords.empty());
        // Sanity check on the texture triangle indices: They should be either empty or equal to tvi.size():
        assert(mesh.tti.empty() || mesh.tti.size() == mesh.tvi.size());
        // Make sure either no texture is given, or a texture and texture coords:
        // (Potential todo: Is there a texturing flag we should check for too?)
        assert(!texture.has_value() || (texture.has_value() && mesh.texcoords.size() > 0));

        using detail::divide_by_w;
        using std::vector;

        vector<Eigen::Vector4<T>> clipspace_vertices;
        for (const auto& vertex_position : mesh.vertices)
        {
            // Note: We make an unnecessary copy of the vertex_position here. We could perhaps improve this by
            // using vertex_shader.operator()<vertex_type, T>(...). We're also making vertex_position the same
            // type as the matrix here, which we wouldn't necessarily need to, as VertexShader supports a
            // VertexType and MatrixType.
            clipspace_vertices.push_back(
                vertex_shader(Eigen::Vector4<T>(vertex_position.homogeneous()), model_view_matrix, projection_matrix));
            // Note: if mesh.colors.empty() (in case of shape-only model!), then the vertex colour is no
            // longer set to gray. But we don't want that here, maybe we only want texturing, then we don't
            // need vertex-colours at all. We can do it in a custom VertexShader if needed.
        }

        // All vertices are in clip-space now. Prepare the rasterisation stage:
        vector<Triangle<T>> triangles_to_raster;
        const auto& tti = mesh.tti.empty() ? mesh.tvi : mesh.tti; // If tti is not empty, we'll use it, otherwise,
                                                                  // use tvi for texturing.

        // In the loop further below, we're building a list of triangles to render, and will be indexing into
        // Mesh::colors. But that array is not available for meshes without per-vertex colouring. So we'll use
        // the below lambda which either returns the colours for the vertex, or an empty vector.
        const auto get_color_or_zero = [](const std::vector<Eigen::Vector3f>& mesh_colors, int vertex_index) {
            if (mesh_colors.size() > 0)
            {
                return mesh_colors[vertex_index];
            } else
            {
                return Eigen::Vector3f(0.0f, 0.0f, 0.0f);
            }
        };

        // This builds the (one and final) triangles to render. Meaning: The triangles formed of mesh.tvi (the
        // ones that survived the clip/culling), plus possibly more that intersect one of the frustum planes
        // (i.e. this can generate new triangles with new pos/vc/texcoords).
        for (std::size_t tri_index = 0; tri_index < mesh.tvi.size(); ++tri_index)
        {
            const auto& tri_indices = mesh.tvi[tri_index];
            const auto& tri_tc_indices = tti[tri_index];
            unsigned char visibility_bits[3];
            for (unsigned char k = 0; k < 3; k++)
            {
                visibility_bits[k] = 0;
                const auto x_cc = clipspace_vertices[tri_indices[k]].x();
                const auto y_cc = clipspace_vertices[tri_indices[k]].y();
                const auto z_cc = clipspace_vertices[tri_indices[k]].z();
                const auto w_cc = clipspace_vertices[tri_indices[k]].w();
                if (x_cc < -w_cc) // true if outside of view frustum. False if on or inside the plane.
                    visibility_bits[k] |= 1; // set bit if outside of frustum
                if (x_cc > w_cc)
                    visibility_bits[k] |= 2;
                if (y_cc < -w_cc)
                    visibility_bits[k] |= 4;
                if (y_cc > w_cc)
                    visibility_bits[k] |= 8;
                if (enable_near_clipping && z_cc < -w_cc) // near plane frustum clipping
                    visibility_bits[k] |= 16;
                if (rasterizer.enable_far_clipping && z_cc > w_cc) // far plane frustum clipping
                    visibility_bits[k] |= 32;
            } // if all bits are 0, then it's inside the frustum
            // all vertices are not visible - reject the triangle.
            if ((visibility_bits[0] & visibility_bits[1] & visibility_bits[2]) > 0)
            {
                continue;
            }
            // all vertices are visible - pass the whole triangle to the rasteriser. = All bits of all 3
            // triangles are 0.
            if ((visibility_bits[0] | visibility_bits[1] | visibility_bits[2]) == 0)
            {
                // relevant part of process_prospective_tri:
                std::array<Eigen::Vector4<T>, 3> prospective_tri{
                    divide_by_w(clipspace_vertices[tri_indices[0]]),
                    divide_by_w(clipspace_vertices[tri_indices[1]]),
                    divide_by_w(clipspace_vertices[tri_indices[2]])};
                // We have a prospective tri in NDC coords now, with its vertices having coords [x_ndc, y_ndc,
                // z_ndc, 1/w_clip].

                // Replaces x and y of the NDC coords with the screen coords. Keep z and w the same.
                const Eigen::Vector2<T> v0_screen =
                    clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[0].x() = v0_screen.x();
                prospective_tri[0].y() = v0_screen.y();
                const Eigen::Vector2<T> v1_screen =
                    clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[1].x() = v1_screen.x();
                prospective_tri[1].y() = v1_screen.y();
                const Eigen::Vector2<T> v2_screen =
                    clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                         rasterizer.viewport_width, rasterizer.viewport_height);
                prospective_tri[2].x() = v2_screen.x();
                prospective_tri[2].y() = v2_screen.y();

                // Culling (front/back/none - or what are OpenGL's modes?). Do we do any culling
                // elsewhere? No?
                if (enable_backface_culling)
                {
                    // Note/Todo: Isn't this just v0_screen, etc.? Let's assume for now it is. So before, we had here:
                    // prospective_tri[0], [1], [2], but we only need their x and y coords.
                    if (!detail::are_vertices_ccw_in_screen_space(
                            Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                            Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                            Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                        continue;
                }

                // Get the bounding box of the triangle:
                const auto boundingBox = detail::calculate_clipped_bounding_box(
                    Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                    Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                    Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                    rasterizer.viewport_width, rasterizer.viewport_height);
                const auto min_x = boundingBox.x;
                const auto max_x = boundingBox.x + boundingBox.width;
                const auto min_y = boundingBox.y;
                const auto max_y = boundingBox.y + boundingBox.height;
                if (max_x <= min_x || max_y <= min_y)
                { // Note: Can the width/height of the bbox be negative? Maybe we only need to check for
                    // equality here?
                    continue;
                }

                // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                triangles_to_raster.push_back(Triangle<T>{
                    detail::Vertex<T>{prospective_tri[0], get_color_or_zero(mesh.colors, tri_indices[0]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                          mesh.texcoords[tri_tc_indices[0]](1))},
                    detail::Vertex<T>{prospective_tri[1], get_color_or_zero(mesh.colors, tri_indices[1]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                          mesh.texcoords[tri_tc_indices[1]](1))},
                    detail::Vertex<T>{prospective_tri[2], get_color_or_zero(mesh.colors, tri_indices[2]),
                                         Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                          mesh.texcoords[tri_tc_indices[2]](1))}});
                continue; // Triangle was either added or not added. Continue with next triangle.
            }
            // At this point, the triangle is known to be intersecting one of the view frustum's planes
            // Note: It seems that this is only w.r.t. the near-plane. If a triangle is partially outside the
            // tlbr viewport, it'll get rejected.
            // Well, 'z' of these triangles seems to be -1, so is that really the near plane?
            std::vector<detail::Vertex<T>> vertices;
            vertices.reserve(3);
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[0]],
                                                    get_color_or_zero(mesh.colors, tri_indices[0]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[0]](0),
                                                                     mesh.texcoords[tri_tc_indices[0]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[1]],
                                                    get_color_or_zero(mesh.colors, tri_indices[1]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[1]](0),
                                                                     mesh.texcoords[tri_tc_indices[1]](1))});
            vertices.push_back(detail::Vertex<T>{clipspace_vertices[tri_indices[2]],
                                                    get_color_or_zero(mesh.colors, tri_indices[2]),
                                                 Eigen::Vector2<T>(mesh.texcoords[tri_tc_indices[2]](0),
                                                                     mesh.texcoords[tri_tc_indices[2]](1))});
            // split the triangle if it intersects the near plane:
            if (enable_near_clipping)
            {
                vertices = clip_polygon_to_plane_in_4d(
                    vertices, Eigen::Vector4<T>(T(0.0), T(0.0), T(-1.0),
                                               T(-1.0))); // "Normal" (or "4D hyperplane") of the near-plane.
                                                          // I tested it and it works like this but I'm a
                                                          // little bit unsure because Songho says the normal
                                                          // of the near-plane is (0,0,-1,1) (maybe I have to
                                                          // switch around the < 0 checks in the function?)
            }

            // Triangulation of the polygon formed of the 'vertices' array:
            if (vertices.size() >= 3)
            {
                for (unsigned char k = 0; k < vertices.size() - 2; k++)
                {
                    // Build a triangle from vertices[0], vertices[1 + k], vertices[2 + k]:
                    // Add to triangles_to_raster if it passed culling etc.
                    // TODO: This does the same as above - the code is copied 1:1. Avoid!
                    // COPY START (but init of prospective_tri is changed, as well as init of 't'.)
                    std::array<Eigen::Vector4<T>, 3> prospective_tri{divide_by_w(vertices[0].position),
                                                                    divide_by_w(vertices[1 + k].position),
                                                                    divide_by_w(vertices[2 + k].position)};

                    const Eigen::Vector2<T> v0_screen =
                        clip_to_screen_space(prospective_tri[0].x(), prospective_tri[0].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[0].x() = v0_screen.x();
                    prospective_tri[0].y() = v0_screen.y();
                    const Eigen::Vector2<T> v1_screen =
                        clip_to_screen_space(prospective_tri[1].x(), prospective_tri[1].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[1].x() = v1_screen.x();
                    prospective_tri[1].y() = v1_screen.y();
                    const Eigen::Vector2<T> v2_screen =
                        clip_to_screen_space(prospective_tri[2].x(), prospective_tri[2].y(),
                                             rasterizer.viewport_width, rasterizer.viewport_height);
                    prospective_tri[2].x() = v2_screen.x();
                    prospective_tri[2].y() = v2_screen.y();

                    if (enable_backface_culling)
                    {
                        if (!detail::are_vertices_ccw_in_screen_space(
                                Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                                Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                                Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y())))
                            continue;
                    }

                    const auto boundingBox = detail::calculate_clipped_bounding_box(
                        Eigen::Vector2<T>(prospective_tri[0].x(), prospective_tri[0].y()),
                        Eigen::Vector2<T>(prospective_tri[1].x(), prospective_tri[1].y()),
                        Eigen::Vector2<T>(prospective_tri[2].x(), prospective_tri[2].y()),
                        rasterizer.viewport_width, rasterizer.viewport_height);
                    const auto min_x = boundingBox.x;
                    const auto max_x = boundingBox.x + boundingBox.width;
                    const auto min_y = boundingBox.y;
                    const auto max_y = boundingBox.y + boundingBox.height;
                    if (max_x <= min_x || max_y <= min_y)
                    {
                        continue;
                    }

                    // If we're here, the triangle is CCW in screen space and the bbox is inside the viewport!
                    triangles_to_raster.push_back(Triangle<T>{
                        detail::Vertex<T>{prospective_tri[0], vertices[0].color, vertices[0].texcoords},
                        detail::Vertex<T>{prospective_tri[1], vertices[1 + k].color,
                                             vertices[1 + k].texcoords},
                        detail::Vertex<T>{prospective_tri[2], vertices[2 + k].color,
                                             vertices[2 + k].texcoords}});
                    // continue; // triangle was either added or not added. Continue with next triangle.
                    // COPY END
                }
            }

        } // end of loop over all triangles

        // Each triangle contains [x_screen, y_screen, z_ndc, 1/w_clip].
        // We may have more triangles than in the original mesh.

        // Raster each triangle and apply the fragment shader on each pixel:
        for (const auto& tri : triangles_to_raster)
        {
            rasterizer.raster_triangle(tri[0], tri[1], tri[2], texture);
        }
        return rasterizer.colorbuffer;
    }